

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O2

void __thiscall tst_benchmark::errorThen(tst_benchmark *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  PromiseData<void> *pPVar7;
  PromiseDataBase<void,_void_()> *this_00;
  QPromiseReject<void> *in_R8;
  char *pcVar8;
  int value;
  undefined4 uStack_1a4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_1a0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_198;
  QPromiseBase<void> local_190;
  QPromiseBase<void> local_180;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_158;
  QPromiseBase<void> local_148;
  int value_1;
  _Any_data local_130;
  undefined1 *local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_110;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_108;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  function<void_()> local_b0;
  Data_conflict local_8c;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QPromiseBase<void> local_68;
  QPromiseBase<void> local_58;
  function<void_()> local_48;
  
  value = 0xffffffff;
  _DAT_00120258 = 0;
  Logger::logs()::logs = 1;
  local_198.d._0_4_ = 0x2a;
  DAT_00120260 = Logger::logs()::logs;
  QtPromise::QPromiseBase<void>::reject<Data>
            ((QPromiseBase<void> *)&local_d8,(Data_conflict *)&local_198);
  local_b0.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011f958;
  pPVar7 = (PromiseData<void> *)operator_new(0x58);
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(pPVar7);
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fb28;
  local_108.super__Function_base._M_functor._8_8_ = pPVar7;
  local_b0.super__Function_base._M_functor._8_8_ = pPVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_108);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_108);
  uVar4 = local_d8._8_8_;
  if (resolver.m_d.d == (Data *)0x0) {
    local_180._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_180._vptr_QPromiseBase = (_func_int **)resolver;
  }
  local_158._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_180._vptr_QPromiseBase == (Data *)0x0) {
    local_190._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_190._vptr_QPromiseBase = local_180._vptr_QPromiseBase;
  }
  local_148._vptr_QPromiseBase = (_func_int **)0x0;
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_48,(PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<void> *)&local_190,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)uVar4,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  uVar4 = local_d8._8_8_;
  local_130._M_unused._M_object = local_180._vptr_QPromiseBase;
  if ((Data *)local_180._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_130._8_8_ = local_190._vptr_QPromiseBase;
  if ((Data *)local_190._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_190._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_190._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_120 = (undefined1 *)&value;
  local_88._M_unused._M_object = operator_new(0x18);
  *(void **)local_88._M_unused._0_8_ = local_130._M_unused._M_object;
  if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_130._8_8_;
  if ((Data *)local_130._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
    UNLOCK();
  }
  *(undefined1 **)((long)local_88._M_unused._0_8_ + 0x10) = local_120;
  pcStack_70 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<void,tst_benchmark::errorThen()::$_0,Data_const&>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::errorThen()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_130._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)uVar4,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_148);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_158);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_b0.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fb28;
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_d8._8_8_);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_d8._8_8_);
  }
  QtPromise::QPromiseBase<void>::wait(&local_58,&local_b0);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_b0);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_d8);
  DAT_00120260 = DAT_00120260 + -1;
  cVar6 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x12a);
  if (cVar6 != '\0') {
    cVar6 = QTest::qCompare(DAT_00120258,1,"Data::logs().copy","1 + 2 * EXCEPT_CALL_COPY_CTOR",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,300);
    if (cVar6 != '\0') {
      cVar6 = QTest::qCompare(DAT_0012025c,0,"Data::logs().move","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0x12d);
      if (cVar6 != '\0') {
        cVar6 = QTest::qCompare(DAT_00120260,0,"Data::logs().refs","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                ,0x12e);
        if (cVar6 != '\0') {
          pcVar8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
          ;
          cVar6 = QTest::qCompare(value,0x2a,"value","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0x12f);
          if (cVar6 != '\0') {
            value_1 = -1;
            _DAT_00120258 = 0;
            local_8c.m_value = 0x2a;
            Logger::logs()::logs = 1;
            DAT_00120260 = 1;
            QtPromise::QPromiseBase<void>::reject<Data>(&local_148,&local_8c);
            local_190._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f958;
            this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
            (this_00->m_catchers).d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                  *)0x0;
            (this_00->m_catchers).d.size = 0;
            (this_00->m_handlers).d.size = 0;
            (this_00->m_catchers).d.d = (Data *)0x0;
            (this_00->m_handlers).d.d = (Data *)0x0;
            (this_00->m_handlers).d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
            *(undefined8 *)&this_00->m_lock = 0;
            *(undefined8 *)&this_00->m_settled = 0;
            ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->
            _vptr_PromiseDataBase = (_func_int **)0x0;
            *(undefined8 *)&this_00->super_QSharedData = 0;
            (this_00->m_error).m_data._M_exception_object = (void *)0x0;
            QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
            LOCK();
            (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
              LOCK();
              (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_108.super__Function_base._M_functor._M_unused._M_object =
                 &PTR__QPromiseBase_0011fb28;
            local_190.m_d.d = (PromiseData<void> *)this_00;
            local_108.super__Function_base._M_functor._8_8_ = this_00;
            QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                      (&resolver,(QPromise<void> *)&local_108);
            QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_108);
            QVar2.d = local_148.m_d.d;
            if (resolver.m_d.d == (Data *)0x0) {
              resolver.m_d.d =
                   (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                   (Data *)0x0;
            }
            else {
              LOCK();
              *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
              UNLOCK();
            }
            _value = (Data *)0x0;
            if (resolver.m_d.d == (Data *)0x0) {
              local_198.d = (Data *)0x0;
            }
            else {
              LOCK();
              (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              local_198 = resolver.m_d.d;
            }
            local_1a0.d = (Data *)0x0;
            local_180._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
            QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                      (&local_b0,(PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_180,
                       (QPromiseResolve<void> *)&local_198,(QPromiseReject<void> *)pcVar8);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                      (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_b0);
            std::_Function_base::~_Function_base(&local_b0.super__Function_base);
            QVar2.d = local_148.m_d.d;
            local_130._M_unused._M_object = local_180._vptr_QPromiseBase;
            if ((Data *)local_180._vptr_QPromiseBase != (Data *)0x0) {
              LOCK();
              (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((QSharedData *)local_180._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_130._8_8_ = local_198.d;
            if (local_198.d != (Data *)0x0) {
              LOCK();
              ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_c8 = (code *)0x0;
            pcStack_c0 = (code *)0x0;
            local_d8._M_unused._M_object = (void *)0x0;
            local_d8._8_8_ = 0;
            local_d8._M_unused._M_object = operator_new(0x18);
            *(void **)local_d8._M_unused._0_8_ = local_130._M_unused._M_object;
            if ((Data *)local_130._M_unused._0_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_130._M_unused._0_8_ = *local_130._M_unused._M_object + 1;
              UNLOCK();
            }
            *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_130._8_8_;
            if ((Data *)local_130._8_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_130._8_8_ = *(int *)local_130._8_8_ + 1;
              UNLOCK();
            }
            pcStack_c0 = std::
                         _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                         ::_M_invoke;
            local_c8 = std::
                       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                       ::_M_manager;
            QtPromisePrivate::PromiseCatcher<void,tst_benchmark::errorThen()::$_1,Data_const&>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::errorThen()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
            ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                      ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_130._M_pod_data);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                      (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
                       (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_d8);
            std::_Function_base::~_Function_base((_Function_base *)&local_d8);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_198);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_1a0);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&local_180);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&value);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&resolver.m_d);
            local_190._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fb28;
            bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                              (&(local_148.m_d.d)->super_PromiseDataBase<void,_void_()>);
            if (!bVar5) {
              QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                        (&(local_148.m_d.d)->super_PromiseDataBase<void,_void_()>);
            }
            local_158._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f958;
            pPVar7 = (PromiseData<void> *)operator_new(0x58);
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                  *)0x0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
            *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock = 0;
            *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = 0;
            (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0
            ;
            *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
            (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
                 (void *)0x0;
            QtPromisePrivate::PromiseData<void>::PromiseData(pPVar7);
            LOCK();
            pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (pPVar7 != (PromiseData<void> *)0x0) {
              LOCK();
              pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_180._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fb28;
            local_180.m_d.d = pPVar7;
            local_158.m_d.d = pPVar7;
            QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                      ((PromiseResolver<void> *)&value,(QPromise<void> *)&local_180);
            QtPromise::QPromiseBase<void>::~QPromiseBase(&local_180);
            QVar2.d = local_190.m_d.d;
            if (_value == (Data *)0x0) {
              local_198.d = (Data *)0x0;
            }
            else {
              LOCK();
              (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              local_198.d = _value;
            }
            local_1a0.d = (Data *)0x0;
            if (local_198.d == (Data *)0x0) {
              local_e0.d = (Data *)0x0;
            }
            else {
              LOCK();
              ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              local_e0.d = local_198.d;
            }
            local_110.d = (Data *)0x0;
            QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                      ((function<void_()> *)&local_130,
                       (PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_198,
                       (QPromiseResolve<void> *)&local_e0,(QPromiseReject<void> *)pcVar8);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                      (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
                       (function<void_()> *)&local_130);
            std::_Function_base::~_Function_base((_Function_base *)&local_130);
            QVar3.d = local_e0.d;
            QVar2.d = local_190.m_d.d;
            resolver.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                 local_198.d;
            if (local_198.d != (Data *)0x0) {
              LOCK();
              ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   ((local_198.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (local_e0.d != (Data *)0x0) {
              LOCK();
              ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_108.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_108.super__Function_base._M_functor._8_8_ = 0;
            local_108.super__Function_base._M_manager = (_Manager_type)0x0;
            local_108._M_invoker = (_Invoker_type)0x0;
            local_108.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
            local_108.super__Function_base._M_functor._M_unused._0_8_)->d = (Data *)resolver.m_d.d;
            if (resolver.m_d.d != (Data *)0x0) {
              LOCK();
              *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
              UNLOCK();
            }
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
            ((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 8))->d = QVar3.d;
            if (QVar3.d != (Data *)0x0) {
              LOCK();
              ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
            ((long)local_108.super__Function_base._M_functor._M_unused._0_8_ + 0x10))->d =
                 (Data *)&value_1;
            local_108._M_invoker =
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_invoke;
            local_108.super__Function_base._M_manager =
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                 ::_M_manager;
            QtPromisePrivate::PromiseCatcher<void,tst_benchmark::errorThen()::$_2,Data_const&>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::errorThen()::$_2_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
            ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                      ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&resolver);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                      (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_108);
            std::_Function_base::~_Function_base(&local_108.super__Function_base);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_e0);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_110);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_198);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&local_1a0);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&value);
            local_158._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011fb28;
            bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                              (&(local_190.m_d.d)->super_PromiseDataBase<void,_void_()>);
            if (!bVar5) {
              QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                        (&(local_190.m_d.d)->super_PromiseDataBase<void,_void_()>);
            }
            QtPromise::QPromiseBase<void>::wait(&local_68,&local_158);
            QtPromise::QPromiseBase<void>::~QPromiseBase(&local_68);
            QtPromise::QPromiseBase<void>::~QPromiseBase(&local_158);
            QtPromise::QPromiseBase<void>::~QPromiseBase(&local_190);
            QtPromise::QPromiseBase<void>::~QPromiseBase(&local_148);
            DAT_00120260 = DAT_00120260 + -1;
            cVar6 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0x13d);
            if (cVar6 != '\0') {
              cVar6 = QTest::qCompare(DAT_00120258,1,"Data::logs().copy",
                                      "1 + 4 * EXCEPT_CALL_COPY_CTOR",
                                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                      ,0x13f);
              if (cVar6 != '\0') {
                cVar6 = QTest::qCompare(DAT_0012025c,0,"Data::logs().move","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                        ,0x140);
                if (cVar6 != '\0') {
                  cVar6 = QTest::qCompare(DAT_00120260,0,"Data::logs().refs","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                          ,0x141);
                  if (cVar6 != '\0') {
                    QTest::qCompare(value_1,0x2a,"value","42",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0x142);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::errorThen()
{
    { // should not copy error on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 2 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not copy error on continuation if rethrown
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<void>::reject(Data{42})
            .fail([](const Data&) {
                throw;
            })
            .fail([&](const Data& res) {
                value = res.value();
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy,
                 1 + 4 * EXCEPT_CALL_COPY_CTOR); // (initial) copy value in std::exception_ptr
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}